

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall
QUrlModel::dataChanged(QUrlModel *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  int iVar1;
  int iVar2;
  QModelIndex *this_00;
  qsizetype qVar3;
  const_reference pWVar4;
  QAbstractItemModel *pQVar5;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QUrlModel *in_RDI;
  long in_FS_OFFSET;
  int i;
  QModelIndex index;
  QModelIndex parent;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  bool local_81;
  QModelIndex *in_stack_ffffffffffffff80;
  int local_6c;
  undefined1 *local_38;
  undefined1 *local_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent(in_stack_ffffffffffffff80);
  local_6c = 0;
  while( true ) {
    this_00 = (QModelIndex *)(long)local_6c;
    qVar3 = QList<QUrlModel::WatchItem>::size(&in_RDI->watching);
    if (qVar3 <= (long)this_00) break;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pWVar4 = QList<QUrlModel::WatchItem>::at
                       ((QList<QUrlModel::WatchItem> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_38._0_4_ = (pWVar4->index).r;
    local_38._4_4_ = (pWVar4->index).c;
    local_30 = (undefined1 *)(pWVar4->index).i;
    local_28.ptr = (pWVar4->index).m.ptr;
    pQVar5 = QModelIndex::model((QModelIndex *)0x7860fa);
    if (pQVar5 != (QAbstractItemModel *)0x0) {
      QModelIndex::model((QModelIndex *)0x78610a);
    }
    iVar1 = QModelIndex::row((QModelIndex *)&local_38);
    iVar2 = QModelIndex::row(in_RSI);
    local_81 = false;
    if (iVar2 <= iVar1) {
      in_stack_ffffffffffffff74 = QModelIndex::row((QModelIndex *)&local_38);
      iVar1 = QModelIndex::row(in_RDX);
      local_81 = false;
      if (in_stack_ffffffffffffff74 <= iVar1) {
        in_stack_ffffffffffffff70 = QModelIndex::column((QModelIndex *)&local_38);
        iVar1 = QModelIndex::column(in_RSI);
        local_81 = false;
        if (iVar1 <= in_stack_ffffffffffffff70) {
          in_stack_ffffffffffffff6c = QModelIndex::column((QModelIndex *)&local_38);
          iVar1 = QModelIndex::column(in_RDX);
          local_81 = false;
          if (in_stack_ffffffffffffff6c <= iVar1) {
            QModelIndex::parent(this_00);
            local_81 = ::operator==((QModelIndex *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    (QModelIndex *)
                                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          }
        }
      }
    }
    if (local_81 != false) {
      QList<QUrlModel::WatchItem>::at
                ((QList<QUrlModel::WatchItem> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      changed(in_RDI,(QString *)this_00);
    }
    local_6c = local_6c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlModel::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    QModelIndex parent = topLeft.parent();
    for (int i = 0; i < watching.size(); ++i) {
        QModelIndex index = watching.at(i).index;
        if (index.model() && topLeft.model()) {
            Q_ASSERT(index.model() == topLeft.model());
        }
        if (   index.row() >= topLeft.row()
            && index.row() <= bottomRight.row()
            && index.column() >= topLeft.column()
            && index.column() <= bottomRight.column()
            && index.parent() == parent) {
                changed(watching.at(i).path);
        }
    }
}